

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O3

uint32 __thiscall Clasp::Asp::RuleTransform::Impl::transformDisjunction(Impl *this,AtomSpan *atoms)

{
  size_t sVar1;
  uint32 uVar2;
  size_t sVar3;
  ulong uVar4;
  uint32 uVar5;
  long lVar6;
  size_type sVar7;
  uint *puVar8;
  uint *puVar9;
  uint local_5c;
  AtomSpan local_58;
  AtomSpan *local_48;
  LitSpan local_40;
  
  sVar7 = (this->lits_).ebo_.size;
  puVar8 = atoms->first;
  sVar1 = atoms->size;
  sVar3 = 1;
  if (sVar1 != 1) {
    lVar6 = 4;
    local_48 = atoms;
    do {
      local_58.first = (uint *)CONCAT44(local_58.first._4_4_,-*(int *)((long)puVar8 + lVar6));
      bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(&this->lits_,(int *)&local_58);
      lVar6 = lVar6 + 4;
    } while (sVar1 << 2 != lVar6);
    puVar8 = local_48->first;
    sVar3 = local_48->size;
  }
  uVar5 = 0;
  puVar9 = puVar8;
  while( true ) {
    local_5c = *puVar9;
    local_40.size = (size_t)(this->lits_).ebo_.size;
    local_40.first = (int *)local_40.size;
    if ((pointer)local_40.size != (pointer)0x0) {
      local_40.first = (this->lits_).ebo_.buf;
    }
    local_58.size = (size_t)(local_5c != 0);
    local_58.first = &local_5c;
    uVar2 = addRule(this,(Head_t)0x0,&local_58,&local_40);
    uVar5 = uVar5 + uVar2;
    if (puVar9 + 1 == puVar8 + sVar3) break;
    uVar4 = (ulong)sVar7;
    sVar7 = sVar7 + 1;
    (this->lits_).ebo_.buf[uVar4] = -*puVar9;
    puVar9 = puVar9 + 1;
  }
  return uVar5;
}

Assistant:

uint32 RuleTransform::Impl::transformDisjunction(const Potassco::AtomSpan& atoms) {
	uint32 bIdx = sizeVec(lits_);
	for (Potassco::AtomSpan::iterator it = Potassco::begin(atoms) + 1, end = Potassco::end(atoms); it != end; ++it) {
		lits_.push_back(Potassco::neg(*it));
	}
	uint32 nRule = 0;
	for (Potassco::AtomSpan::iterator it = Potassco::begin(atoms), end = Potassco::end(atoms);;) {
		nRule += addRule(*it, Potassco::toSpan(lits_));
		if (++it == end) { break; }
		lits_[bIdx++] = Potassco::neg(*(it-1));
	}
	return nRule;
}